

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::tydra::(anonymous_namespace)::UniformToFaceVarying_abi_cxx11_
          (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *src,size_t stride_bytes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts)

{
  size_t sVar1;
  size_type sVar2;
  ulong uVar3;
  const_reference pvVar4;
  uchar *__dest;
  uchar *puVar5;
  iterator __first;
  iterator __last;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_178;
  const_iterator local_170;
  ulong local_168;
  size_t k;
  size_t cnt;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator local_129;
  string local_128 [32];
  string local_108;
  undefined1 local_e8 [40];
  size_t num_uniforms;
  allocator local_b1;
  string local_b0 [32];
  string local_90;
  undefined1 local_70 [48];
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts_local;
  size_t stride_bytes_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *src_local;
  
  dst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)stride_bytes;
  faceVertexCounts_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)src;
  stride_bytes_local = (size_t)this;
  src_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  if (faceVertexCounts_local == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    local_70._40_8_ =
         nonstd::expected_lite::make_unexpected<char_const(&)[22]>
                   ((char (*) [22])"stride_bytes is zero.");
    nonstd::expected_lite::
    expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>
              (__return_storage_ptr__,(unexpected_type<const_char_*> *)(local_70 + 0x28));
    local_70._36_4_ = 1;
  }
  else {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)stride_bytes_local);
    if (sVar2 % (ulong)faceVertexCounts_local == 0) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)stride_bytes_local
                        );
      uVar3 = sVar2 / (ulong)faceVertexCounts_local;
      local_e8._32_8_ = uVar3;
      sVar2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         dst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (uVar3 == sVar2) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                   (size_type)faceVertexCounts_local);
        cnt = 0;
        while( true ) {
          sVar1 = cnt;
          sVar2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             dst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar2 <= sVar1) break;
          pvVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              dst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,cnt);
          k = (size_t)*pvVar4;
          __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              stride_bytes_local);
          memcpy(__dest,puVar5 + cnt * (long)faceVertexCounts_local,(size_t)faceVertexCounts_local);
          for (local_168 = 0; local_168 < k; local_168 = local_168 + 1) {
            local_178._M_current =
                 (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_40);
            __gnu_cxx::
            __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::__normal_iterator<unsigned_char*>
                      ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)&local_170,&local_178);
            __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
            __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
            ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
            insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_40,local_170,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )__first._M_current,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )__last._M_current);
          }
          cnt = cnt + 1;
        }
        nonstd::expected_lite::
        expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_0>
                  (__return_storage_ptr__,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        local_70._36_4_ = 1;
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_128,
                   "The number of input uniform attributes {} must be the same with faceVertexCounts.size() {}"
                   ,&local_129);
        buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 dst.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
        fmt::format<unsigned_long,unsigned_long>
                  (&local_108,(fmt *)local_128,(string *)(local_e8 + 0x20),
                   (unsigned_long *)
                   &buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(unsigned_long *)faceVertexCounts);
        nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                  ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_e8,(expected_lite *)&local_108,value_00);
        nonstd::expected_lite::
        expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (__return_storage_ptr__,
                   (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict1
                    *)local_e8);
        nonstd::expected_lite::
        unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_e8);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::__cxx11::string::~string(local_128);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_129);
        local_70._36_4_ = 1;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_b0,"input bytes {} must be the multiple of stride_bytes {}",&local_b1);
      num_uniforms = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                stride_bytes_local);
      fmt::format<unsigned_long,unsigned_long>
                (&local_90,(fmt *)local_b0,(string *)&num_uniforms,
                 (unsigned_long *)&faceVertexCounts_local,(unsigned_long *)faceVertexCounts);
      nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_70,(expected_lite *)&local_90,value);
      nonstd::expected_lite::
      expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict1
                  *)local_70);
      nonstd::expected_lite::
      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string(local_b0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      local_70._36_4_ = 1;
    }
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<std::vector<uint8_t>, std::string> UniformToFaceVarying(
    const std::vector<uint8_t> &src, const size_t stride_bytes,
    const std::vector<uint32_t> &faceVertexCounts) {
  std::vector<uint8_t> dst;

  if (stride_bytes == 0) {
    return nonstd::make_unexpected("stride_bytes is zero.");
  }

  if ((src.size() % stride_bytes) != 0) {
    return nonstd::make_unexpected(
        fmt::format("input bytes {} must be the multiple of stride_bytes {}",
                    src.size(), stride_bytes));
  }

  size_t num_uniforms = src.size() / stride_bytes;

  if (num_uniforms != faceVertexCounts.size()) {
    return nonstd::make_unexpected(fmt::format(
        "The number of input uniform attributes {} must be the same with "
        "faceVertexCounts.size() {}",
        num_uniforms, faceVertexCounts.size()));
  }

  std::vector<uint8_t> buf;
  buf.resize(stride_bytes);

  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    size_t cnt = faceVertexCounts[i];

    memcpy(buf.data(), src.data() + i * stride_bytes, stride_bytes);

    // repeat cnt times.
    for (size_t k = 0; k < cnt; k++) {
      dst.insert(dst.end(), buf.begin(), buf.end());
    }
  }

  return dst;
}